

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O2

void __thiscall NEST::LArNEST::LArNEST(LArNEST *this,VDetector *detector)

{
  NESTcalc::NESTcalc(&this->super_NESTcalc,detector);
  (this->super_NESTcalc)._vptr_NESTcalc = (_func_int **)&PTR__LArNEST_0011bb58;
  this->fUseDokeBirks = false;
  this->fDensity = 1.393;
  this->fRIdealGas = 8.31446261815324;
  this->fRealGasA = 0.1355;
  this->fRealGasB = 3.201e-05;
  this->fTemperature = 85.0;
  this->fWorkQuantaFunction = 19.5;
  this->fWorkIonFunction = 23.6;
  this->fWorkPhotonFunction = 14.544;
  this->fNexOverNion = 0.21;
  this->fALF = 0.8264462809917356;
  this->fFanoER = 0.1115;
  (this->fNR).alpha = 11.1;
  (this->fNR).beta = 0.087;
  (this->fNR).gamma = 0.1;
  (this->fNR).delta = -0.0932;
  (this->fNR).epsilon = 2.998;
  (this->fNR).zeta = 0.3;
  (this->fNR).eta = 2.94;
  LArERYieldsParameters::LArERYieldsParameters(&this->fER);
  LArAlphaYieldsParameters::LArAlphaYieldsParameters(&this->fAlpha);
  (this->fThomasImelParameters).A = 0.1;
  (this->fThomasImelParameters).B = -0.0932;
  DriftParameters::DriftParameters(&this->fDriftParameters);
  return;
}

Assistant:

LArNEST::LArNEST(VDetector *detector) : NESTcalc(detector) {}